

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# md5.hpp
# Opt level: O0

uint32_t rest_rpc::MD5::MD5CE::CalcF(uint32_t i,IntermediateData *intermediate)

{
  uint32_t uVar1;
  long in_RSI;
  uint32_t in_EDI;
  
  uVar1 = CalcF(in_EDI,*(uint32_t *)(in_RSI + 4),*(uint32_t *)(in_RSI + 8),
                *(uint32_t *)(in_RSI + 0xc));
  return uVar1;
}

Assistant:

static uint32_t CalcF(const uint32_t i,
                        const IntermediateData &intermediate) {
    return CalcF(i, intermediate.b, intermediate.c, intermediate.d);
  }